

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

string * __thiscall
onmt::Tokenizer::detokenize_abi_cxx11_
          (Tokenizer *this,vector<onmt::Token,_std::allocator<onmt::Token>_> *tokens,Ranges *ranges,
          bool merge_ranges,vector<unsigned_long,_std::allocator<unsigned_long>_> *index_map)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong uVar5;
  map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *this_00;
  long in_RCX;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *in_RDX;
  long in_RSI;
  string *in_RDI;
  byte in_R8B;
  _Base_ptr in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>,_bool>
  pVar6;
  string *in_stack_00000058;
  Casing in_stack_00000064;
  string *in_stack_00000068;
  string prep_word;
  value_type *token;
  size_t i;
  string *line;
  Ranges *in_stack_00000180;
  string *in_stack_00000188;
  map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *in_stack_fffffffffffffe98;
  map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *in_stack_fffffffffffffea0;
  tuple<unsigned_long_&&,_unsigned_long_&&> *__args_2;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>
  in_stack_fffffffffffffeb8;
  tuple<unsigned_long_&&,_unsigned_long_&&> local_b0;
  string local_98 [24];
  _Base_ptr in_stack_ffffffffffffff80;
  string local_78 [32];
  const_reference local_58;
  map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_50;
  long local_20;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *local_18;
  
  local_50._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = in_R8B & 1;
  local_50._M_t._M_impl.super__Rb_tree_header._M_header._M_left._7_1_ = 0;
  local_50._M_t._M_impl.super__Rb_tree_header._M_header._M_right = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)in_RDI);
  std::vector<onmt::Token,_std::allocator<onmt::Token>_>::size(local_18);
  std::__cxx11::string::reserve((ulong)in_RDI);
  for (local_50._M_t._M_impl._0_8_ = 0; uVar1 = local_50._M_t._M_impl._0_8_,
      sVar3 = std::vector<onmt::Token,_std::allocator<onmt::Token>_>::size(local_18),
      (ulong)uVar1 < sVar3; local_50._M_t._M_impl._0_8_ = local_50._M_t._M_impl._0_8_ + 1) {
    local_58 = std::vector<onmt::Token,_std::allocator<onmt::Token>_>::operator[]
                         (local_18,local_50._M_t._M_impl._0_8_);
    if (((((*(byte *)(in_RSI + 0x34) & 1) == 0) && (local_50._M_t._M_impl._0_8_ != 0)) &&
        (pvVar4 = std::vector<onmt::Token,_std::allocator<onmt::Token>_>::operator[]
                            (local_18,local_50._M_t._M_impl._0_8_ - 1),
        (pvVar4->join_right & 1U) == 0)) && ((local_58->join_left & 1U) == 0)) {
      std::__cxx11::string::operator+=((string *)in_RDI,' ');
    }
    std::__cxx11::string::string(local_78,(string *)local_58);
    bVar2 = Token::is_placeholder((Token *)0x3c24fc);
    if (!bVar2) {
      if ((local_58->casing != None) && (local_58->casing != Lowercase)) {
        restore_token_casing(in_stack_00000068,in_stack_00000064,in_stack_00000058);
        std::__cxx11::string::operator=(local_78,local_98);
        std::__cxx11::string::~string(local_98);
      }
      unescape_characters((string *)in_stack_ffffffffffffff80);
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      if (local_20 != 0) {
        if (local_50._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0) {
          this_00 = &local_50;
        }
        else {
          this_00 = (map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                     *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
        }
        in_stack_fffffffffffffea0 =
             (map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
              *)&stack0xffffffffffffff60;
        std::forward_as_tuple<unsigned_long_const&>((unsigned_long *)in_stack_fffffffffffffe98);
        std::__cxx11::string::size();
        in_stack_fffffffffffffe98 =
             (map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
              *)std::__cxx11::string::size();
        std::__cxx11::string::size();
        __args_2 = &local_b0;
        std::forward_as_tuple<unsigned_long,unsigned_long>
                  ((unsigned_long *)__args_2,(unsigned_long *)in_stack_fffffffffffffea0);
        pVar6 = std::
                map<unsigned_long,std::pair<unsigned_long,unsigned_long>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
                ::
                emplace<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<unsigned_long&&,unsigned_long&&>>
                          (this_00,(piecewise_construct_t *)in_stack_fffffffffffffeb8._M_node,
                           (tuple<const_unsigned_long_&> *)
                           CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),__args_2);
        in_stack_fffffffffffffeb8 = pVar6.first._M_node;
        in_stack_fffffffffffffeb7 = pVar6.second;
      }
      std::__cxx11::string::append((string *)in_RDI);
    }
    std::__cxx11::string::~string(local_78);
  }
  if ((local_20 != 0) &&
     ((local_50._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0)) {
    merge_consecutive_ranges(in_stack_00000188,in_stack_00000180);
    std::
    map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::
    map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::~map((map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            *)0x3c2767);
  }
  return in_RDI;
}

Assistant:

std::string Tokenizer::detokenize(const std::vector<Token>& tokens,
                                    Ranges* ranges,
                                    bool merge_ranges,
                                    const std::vector<size_t>* index_map) const
  {
    std::string line;
    line.reserve(tokens.size() * 10);

    for (size_t i = 0; i < tokens.size(); ++i)
    {
      const auto& token = tokens[i];
      if (!_options.with_separators && i > 0 && !tokens[i - 1].join_right && !token.join_left)
        line += ' ';

      std::string prep_word = token.surface;

      if (!token.is_placeholder())
      {
        if (token.casing != Casing::None && token.casing != Casing::Lowercase)
          prep_word = restore_token_casing(prep_word, token.casing, _options.lang);
        unescape_characters(prep_word);
      }

      if (!prep_word.empty())
      {
        if (ranges)
          ranges->emplace(std::piecewise_construct,
                          std::forward_as_tuple(index_map ? index_map->at(i) : i),
                          std::forward_as_tuple(line.size(), line.size() + prep_word.size() - 1));

        line.append(prep_word);
      }
    }

    if (ranges && merge_ranges)
      *ranges = merge_consecutive_ranges(line, *ranges);

    return line;
  }